

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaveLoadTests.cpp
# Opt level: O2

int testBasicSaveLoad(void)

{
  bool bVar1;
  int iVar2;
  Model *this;
  OneHotEncoder *this_00;
  StringVector *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  char *pcVar6;
  allocator<char> local_e9;
  undefined1 local_e8 [40];
  Model a2;
  OneHotEncoder ohe;
  FeatureType local_88;
  FeatureType local_78;
  string path;
  _Vector_base<long,_std::allocator<long>_> local_48;
  Result r;
  
  CoreML::Result::Result(&r);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,"/tmp/a.modelasset",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"",(allocator<char> *)&a2);
  CoreML::OneHotEncoder::OneHotEncoder(&ohe,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&a2,"foo",&local_e9);
  CoreML::FeatureType::String();
  CoreML::OneHotEncoder::addInput((Result *)local_e8,&ohe,(string *)&a2,&local_78);
  bVar1 = CoreML::Result::good((Result *)local_e8);
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.m_type.
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&a2);
  if (bVar1) {
    this = CoreML::Model::getProto(&ohe.super_Model);
    this_00 = CoreML::Specification::Model::mutable_onehotencoder(this);
    pSVar3 = CoreML::Specification::OneHotEncoder::mutable_stringcategories(this_00);
    pbVar4 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(&pSVar3->vector_);
    std::__cxx11::string::assign((char *)pbVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&a2,"bar",&local_e9);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CoreML::FeatureType::Array(&local_88,(vector<long,_std::allocator<long>_> *)&local_48);
    CoreML::Model::addOutput((Result *)local_e8,&ohe.super_Model,(string *)&a2,&local_88);
    bVar1 = CoreML::Result::good((Result *)local_e8);
    std::__cxx11::string::~string((string *)(local_e8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.m_type.
                super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&a2);
    if (bVar1) {
      CoreML::Model::save((Result *)local_e8,&ohe.super_Model,&path);
      bVar1 = CoreML::Result::good((Result *)local_e8);
      std::__cxx11::string::~string((string *)(local_e8 + 8));
      if (bVar1) {
        CoreML::Model::Model(&a2);
        CoreML::Model::load((Result *)local_e8,&path,&a2);
        bVar1 = CoreML::Result::good((Result *)local_e8);
        std::__cxx11::string::~string((string *)(local_e8 + 8));
        if (bVar1) {
          bVar1 = CoreML::Model::operator==(&ohe.super_Model,&a2);
          if (!bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x1a);
            poVar5 = std::operator<<(poVar5,": error: ");
            pcVar6 = "(ohe) == (a2)";
            goto LAB_0016193e;
          }
          iVar2 = remove(path._M_dataplus._M_p);
          if (iVar2 != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x1b);
            poVar5 = std::operator<<(poVar5,": error: ");
            pcVar6 = "(std::remove(path.c_str())) == (0)";
            goto LAB_0016193e;
          }
          iVar2 = 0;
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x19);
          poVar5 = std::operator<<(poVar5,": error: ");
          pcVar6 = "(Model::load(path, a2)).good()";
LAB_0016193e:
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar5);
          iVar2 = 1;
        }
        CoreML::Model::~Model(&a2);
        goto LAB_00161887;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x17);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar6 = "(ohe.save(path)).good()";
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x16);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar6 = "(ohe.addOutput(\"bar\", FeatureType::Array({}))).good()";
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/SaveLoadTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x14);
    poVar5 = std::operator<<(poVar5,": error: ");
    pcVar6 = "(ohe.addInput(\"foo\", FeatureType::String())).good()";
  }
  poVar5 = std::operator<<(poVar5,pcVar6);
  poVar5 = std::operator<<(poVar5," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar2 = 1;
LAB_00161887:
  CoreML::Model::~Model(&ohe.super_Model);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&r.m_message);
  return iVar2;
}

Assistant:

int testBasicSaveLoad () {
    Result r;
    
    const std::string path("/tmp/a.modelasset");
    OneHotEncoder ohe;
    ML_ASSERT_GOOD(ohe.addInput("foo", FeatureType::String()));
    ohe.getProto().mutable_onehotencoder()->mutable_stringcategories()->add_vector()->assign("foo");
    ML_ASSERT_GOOD(ohe.addOutput("bar", FeatureType::Array({})));
    ML_ASSERT_GOOD(ohe.save(path));
    Model a2;
    ML_ASSERT_GOOD(Model::load(path, a2));
    ML_ASSERT_EQ(ohe, a2);
    ML_ASSERT_EQ(std::remove(path.c_str()), 0);
    
    return 0;
}